

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

node * list_insert_node(list *list,node *node)

{
  node *pnVar1;
  
  if (node == (node *)0x0 || list == (list *)0x0) {
    node = (node *)0x0;
  }
  else {
    if (list->head != (node *)0x0) {
      pnVar1 = list_insert_node_before(list,list->head,node);
      return pnVar1;
    }
    list->head = node;
    list->tail = node;
    list->size = list->size + 1;
  }
  return node;
}

Assistant:

struct node *list_insert_node(struct list *list, struct node *node)
{
        if (list == NULL || node == NULL) {
                return NULL;
        }

        if (list->head == NULL) {
                list->head = node;
                list->tail = node;

                ++list->size;

                return node;
        } else {
                return list_insert_node_before(list, list->head, node);
        }
}